

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

sunindextype
SUNDlsMat_bandGBTRF(sunrealtype **a,sunindextype n,sunindextype mu,sunindextype ml,sunindextype smu,
                   sunindextype *p)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  sunrealtype *in_R9;
  sunindextype storage_k;
  sunindextype storage_l;
  sunindextype l;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  sunindextype num_rows;
  sunindextype r;
  sunindextype c;
  long local_100;
  long local_f8;
  double local_d0;
  double *local_c8;
  double *local_c0;
  sunrealtype sStack_70;
  int swap;
  sunrealtype a_kj;
  sunrealtype mult;
  sunrealtype temp;
  sunrealtype max;
  sunrealtype *jptr;
  sunrealtype *kptr;
  sunrealtype *col_j;
  sunrealtype *sub_diag_k;
  sunrealtype *diag_k;
  sunrealtype *col_k;
  sunrealtype *a_c;
  sunindextype last_row_k;
  sunindextype last_col_k;
  
  if (0 < in_R8 - in_RDX) {
    for (kptr = (sunrealtype *)0x0; (long)kptr < in_RSI; kptr = (sunrealtype *)((long)kptr + 1)) {
      lVar2 = *(long *)(in_RDI + (long)kptr * 8);
      for (jptr = (sunrealtype *)0x0; (long)jptr < in_R8 - in_RDX;
          jptr = (sunrealtype *)((long)jptr + 1)) {
        *(undefined8 *)(lVar2 + (long)jptr * 8) = 0;
      }
    }
  }
  a_kj = 0.0;
  col_j = in_R9;
  while( true ) {
    if (in_RSI + -1 <= (long)a_kj) {
      *col_j = (sunrealtype)(in_RSI + -1);
      dVar1 = *(double *)(*(long *)(in_RDI + (in_RSI + -1) * 8) + in_R8 * 8);
      if ((dVar1 != 0.0) || (last_col_k = in_RSI, NAN(dVar1))) {
        last_col_k = 0;
      }
      return last_col_k;
    }
    lVar2 = *(long *)(in_RDI + (long)a_kj * 8);
    pdVar3 = (double *)(lVar2 + in_R8 * 8);
    pdVar4 = pdVar3 + 1;
    if (in_RSI + -1 < (long)a_kj + in_RCX) {
      local_f8 = in_RSI + -1;
    }
    else {
      local_f8 = (long)a_kj + in_RCX;
    }
    sStack_70 = a_kj;
    local_d0 = ABS(*pdVar3);
    local_c0 = pdVar4;
    temp = a_kj;
    while (temp = (sunrealtype)((long)temp + 1), (long)temp <= local_f8) {
      if (local_d0 < ABS(*local_c0)) {
        sStack_70 = temp;
        local_d0 = ABS(*local_c0);
      }
      local_c0 = local_c0 + 1;
    }
    lVar5 = ((long)sStack_70 - (long)a_kj) + in_R8;
    *col_j = sStack_70;
    dVar1 = *(double *)(lVar2 + lVar5 * 8);
    if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
    if (sStack_70 != a_kj) {
      dVar1 = *(double *)(lVar2 + lVar5 * 8);
      *(double *)(lVar2 + lVar5 * 8) = *pdVar3;
      *pdVar3 = dVar1;
    }
    dVar1 = *pdVar3;
    local_c0 = pdVar4;
    temp = a_kj;
    while (temp = (sunrealtype)((long)temp + 1), (long)temp <= local_f8) {
      *local_c0 = (-1.0 / dVar1) * *local_c0;
      local_c0 = local_c0 + 1;
    }
    mult = a_kj;
    if ((long)a_kj + in_R8 < in_RSI + -1) {
      local_100 = (long)a_kj + in_R8;
    }
    else {
      local_100 = in_RSI + -1;
    }
    while (mult = (sunrealtype)((long)mult + 1), (long)mult <= local_100) {
      lVar2 = *(long *)(in_RDI + (long)mult * 8);
      lVar5 = ((long)sStack_70 - (long)mult) + in_R8;
      lVar6 = ((long)a_kj - (long)mult) + in_R8;
      dVar1 = *(double *)(lVar2 + lVar5 * 8);
      if (sStack_70 != a_kj) {
        *(undefined8 *)(lVar2 + lVar5 * 8) = *(undefined8 *)(lVar2 + lVar6 * 8);
        *(double *)(lVar2 + lVar6 * 8) = dVar1;
      }
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        local_c8 = (double *)(lVar2 + ((((long)a_kj + 1) - (long)mult) + in_R8) * 8);
        local_c0 = pdVar4;
        temp = a_kj;
        while (temp = (sunrealtype)((long)temp + 1), (long)temp <= local_f8) {
          *local_c8 = dVar1 * *local_c0 + *local_c8;
          local_c0 = local_c0 + 1;
          local_c8 = local_c8 + 1;
        }
      }
    }
    a_kj = (sunrealtype)((long)a_kj + 1);
    col_j = col_j + 1;
  }
  return (long)a_kj + 1;
}

Assistant:

sunindextype SUNDlsMat_bandGBTRF(sunrealtype** a, sunindextype n,
                                 sunindextype mu, sunindextype ml,
                                 sunindextype smu, sunindextype* p)
{
  sunindextype c, r, num_rows;
  sunindextype i, j, k, l, storage_l, storage_k, last_col_k, last_row_k;
  sunrealtype *a_c, *col_k, *diag_k, *sub_diag_k, *col_j, *kptr, *jptr;
  sunrealtype max, temp, mult, a_kj;
  sunbooleantype swap;

  /* zero out the first smu - mu rows of the rectangular array a */

  num_rows = smu - mu;
  if (num_rows > 0)
  {
    for (c = 0; c < n; c++)
    {
      a_c = a[c];
      for (r = 0; r < num_rows; r++) { a_c[r] = ZERO; }
    }
  }

  /* k = elimination step number */

  for (k = 0; k < n - 1; k++, p++)
  {
    col_k      = a[k];
    diag_k     = col_k + smu;
    sub_diag_k = diag_k + 1;
    last_row_k = SUNMIN(n - 1, k + ml);

    /* find l = pivot row number */

    l   = k;
    max = SUNRabs(*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      if (SUNRabs(*kptr) > max)
      {
        l   = i;
        max = SUNRabs(*kptr);
      }
    }
    storage_l = ROW(l, k, smu);
    *p        = l;

    /* check for zero pivot element */

    if (col_k[storage_l] == ZERO) { return (k + 1); }

    /* swap a(l,k) and a(k,k) if necessary */

    if ((swap = (l != k)))
    {
      temp             = col_k[storage_l];
      col_k[storage_l] = *diag_k;
      *diag_k          = temp;
    }

    /* Scale the elements below the diagonal in         */
    /* column k by -1.0 / a(k,k). After the above swap, */
    /* a(k,k) holds the pivot element. This scaling     */
    /* stores the pivot row multipliers -a(i,k)/a(k,k)  */
    /* in a(i,k), i=k+1, ..., SUNMIN(n-1,k+ml).            */

    mult = -ONE / (*diag_k);
    for (i = k + 1, kptr = sub_diag_k; i <= last_row_k; i++, kptr++)
    {
      (*kptr) *= mult;
    }

    /* row_i = row_i - [a(i,k)/a(k,k)] row_k, i=k+1, ..., SUNMIN(n-1,k+ml) */
    /* row k is the pivot row after swapping with row l.                */
    /* The computation is done one column at a time,                    */
    /* column j=k+1, ..., SUNMIN(k+smu,n-1).                               */

    last_col_k = SUNMIN(k + smu, n - 1);
    for (j = k + 1; j <= last_col_k; j++)
    {
      col_j     = a[j];
      storage_l = ROW(l, j, smu);
      storage_k = ROW(k, j, smu);
      a_kj      = col_j[storage_l];

      /* Swap the elements a(k,j) and a(k,l) if l!=k. */

      if (swap)
      {
        col_j[storage_l] = col_j[storage_k];
        col_j[storage_k] = a_kj;
      }

      /* a(i,j) = a(i,j) - [a(i,k)/a(k,k)]*a(k,j) */
      /* a_kj = a(k,j), *kptr = - a(i,k)/a(k,k), *jptr = a(i,j) */

      if (a_kj != ZERO)
      {
        for (i = k + 1, kptr = sub_diag_k, jptr = col_j + ROW(k + 1, j, smu);
             i <= last_row_k; i++, kptr++, jptr++)
        {
          (*jptr) += a_kj * (*kptr);
        }
      }
    }
  }

  /* set the last pivot row to be n-1 and check for a zero pivot */

  *p = n - 1;
  if (a[n - 1][smu] == ZERO) { return (n); }

  /* return 0 to indicate success */

  return (0);
}